

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O0

void __thiscall
kj::_::
AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
::fulfill(AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
          *this,Client *value)

{
  Client *value_00;
  ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client> local_1d0;
  Client *local_18;
  Client *value_local;
  AdapterPromiseNode<capnproto_test::capnp::test::TestMembrane::Client,_kj::_::PromiseAndFulfillerAdapter<capnproto_test::capnp::test::TestMembrane::Client>_>
  *this_local;
  
  if ((this->waiting & 1U) != 0) {
    this->waiting = false;
    local_18 = value;
    value_local = (Client *)this;
    value_00 = mv<capnproto_test::capnp::test::TestMembrane::Client>(value);
    ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client>::ExceptionOr(&local_1d0,value_00)
    ;
    ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client>::operator=
              (&this->result,&local_1d0);
    ExceptionOr<capnproto_test::capnp::test::TestMembrane::Client>::~ExceptionOr(&local_1d0);
    AdapterPromiseNodeBase::setReady(&this->super_AdapterPromiseNodeBase);
  }
  return;
}

Assistant:

void fulfill(T&& value) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(kj::mv(value));
      setReady();
    }
  }